

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CheckVisibilityRulesVisit
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto,
          VisibilityCheckerState *state)

{
  pointer *ppEVar1;
  bool bVar2;
  vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
  *this_00;
  iterator __position;
  EnumDescriptorAndProto local_28;
  
  if (enm->containing_type_ != (Descriptor *)0x0) {
    bVar2 = IsEnumNamespaceMessage(this,enm);
    if (bVar2) {
      __position._M_current =
           (state->namespaced_enums).
           super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (state->namespaced_enums).
          super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        (__position._M_current)->descriptor = enm;
        (__position._M_current)->proto = proto;
        ppEVar1 = &(state->namespaced_enums).
                   super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + 1;
        return;
      }
      this_00 = &state->namespaced_enums;
    }
    else {
      __position._M_current =
           (state->nested_enums).
           super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (state->nested_enums).
          super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        (__position._M_current)->descriptor = enm;
        (__position._M_current)->proto = proto;
        ppEVar1 = &(state->nested_enums).
                   super__Vector_base<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + 1;
        return;
      }
      this_00 = &state->nested_enums;
    }
    local_28.descriptor = enm;
    local_28.proto = proto;
    std::
    vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
    ::_M_realloc_insert<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>
              (this_00,__position,&local_28);
  }
  return;
}

Assistant:

void DescriptorBuilder::CheckVisibilityRulesVisit(
    const EnumDescriptor& enm, const EnumDescriptorProto& proto,
    VisibilityCheckerState& state) {
  if (enm.containing_type() != nullptr) {
    if (IsEnumNamespaceMessage(enm)) {
      state.namespaced_enums.push_back(EnumDescriptorAndProto{&enm, &proto});
    } else {
      state.nested_enums.push_back(EnumDescriptorAndProto{&enm, &proto});
    }
  }
}